

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall stringToUnits_words_Test::~stringToUnits_words_Test(stringToUnits_words_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(stringToUnits, words)
{
    EXPECT_EQ(precise::mph, unit_from_string("miles per hour"));
    EXPECT_EQ(precise::mm.pow(3), unit_from_string("cubic millimeters"));
    EXPECT_EQ(
        precise::kg.pow(3) / precise::m.pow(2),
        unit_from_string("cubic kilograms per square meter"));
    EXPECT_EQ(precise::K * precise::milli, unit_from_string("milliKelvins"));
    EXPECT_EQ(precise::Hz, unit_from_string("reciprocal seconds"));
    EXPECT_EQ(precise::m.pow(2), unit_from_string("metres squared"));
    EXPECT_EQ(precise::mm.pow(2), unit_from_string("square millimeter"));
    EXPECT_EQ(precise::N * precise::m, unit_from_string("newton meter"));
    EXPECT_EQ(precise::ft * precise::lbf, unit_from_string("ftlb"));
    EXPECT_EQ(
        precise::ft * precise::lbf * precise::s,
        unit_from_string("ftlbsecond"));
    EXPECT_EQ(
        precise::gal * precise::second * precise::hp,
        unit_from_string("gallon second horsepower"));
    EXPECT_EQ(
        precise::Hz * precise::milli * precise::micro * precise::m,
        unit_from_string("millihertz micrometer"));

    EXPECT_TRUE(is_error(unit_from_string("bob and harry")));
    EXPECT_EQ(precise::pico * precise::T, unit_from_string("picotesla"));
    EXPECT_EQ(precise::pico * precise::A, unit_from_string("picoampere"));
    EXPECT_EQ(
        precise::pressure::psi, unit_from_string("pound per square inch"));
    EXPECT_EQ(
        precise::lm * precise::m.pow(2),
        unit_from_string("lumen square meter"));

    EXPECT_EQ(
        unit_from_string("ampere per square metre kelvin squared"),
        precise::A / (m.pow(2) * K.pow(2)));

    EXPECT_EQ(unit_from_string("reciprocal cubic meter"), precise::m.pow(-3));
    EXPECT_EQ(
        unit_from_string("sixty fourths of an inch"),
        precise_unit(1.0 / 64.0, precise::in));

    EXPECT_EQ(
        unit_from_string("sixty fourths of a   mile"),
        precise_unit(1.0 / 64.0, precise::mile));

    EXPECT_EQ(
        unit_from_string("thirty-seconds of a yard"),
        precise_unit(1.0 / 32.0, precise::yd));
}